

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::checksegments(tetgenmesh *this)

{
  memorypool *pmVar1;
  void **ppvVar2;
  tetrahedron ppdVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  double *pdVar6;
  tetrahedron ppdVar7;
  ulong uVar8;
  ulong uVar9;
  tetrahedron pe;
  int iVar10;
  tetrahedron *pppdVar11;
  ulong *puVar12;
  void *pvVar13;
  long lVar14;
  ulong *puVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  int (*paiVar25) [12];
  tetrahedron *pppdVar26;
  ulong uVar27;
  tetrahedron *pppdVar28;
  double dVar29;
  uint uStackY_d0;
  int iStackY_cc;
  ulong uStackY_c8;
  ulong in_stack_ffffffffffffff88;
  undefined4 uVar30;
  ulong local_48;
  
  if (this->b->quiet == 0) {
    puts("  Checking tet->seg connections...");
  }
  pmVar1 = this->tetrahedrons;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  uVar23 = 0;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  pppdVar11 = tetrahedrontraverse(this);
  if (pppdVar11 != (tetrahedron *)0x0) {
    uVar23 = 0;
    local_48 = 0;
    do {
      ppdVar3 = pppdVar11[8];
      if (ppdVar3 != (tetrahedron)0x0) {
        lVar14 = 0;
        do {
          uVar19 = (ulong)ppdVar3[lVar14] & 0xfffffffffffffff8;
          if (uVar19 != 0) {
            iVar10 = edge2ver[lVar14];
            ppdVar4 = *(tetrahedron *)(uVar19 + 0x18);
            ppdVar5 = *(tetrahedron *)(uVar19 + 0x20);
            pppdVar28 = pppdVar11;
            if (((pppdVar11[orgpivot[iVar10]] == ppdVar4) &&
                (pppdVar11[destpivot[iVar10]] == ppdVar5)) ||
               ((pppdVar11[orgpivot[iVar10]] == ppdVar5 && (pppdVar11[destpivot[iVar10]] == ppdVar4)
                ))) {
              do {
                if (pppdVar28[8] == (tetrahedron)0x0) {
                  uVar27 = 0;
                }
                else {
                  pdVar6 = pppdVar28[8][ver2edge[iVar10]];
                  local_48 = (ulong)pdVar6 & 7;
                  uVar27 = (ulong)pdVar6 & 0xfffffffffffffff8;
                }
                if (uVar27 != uVar19) {
                  puts("  !! Wrong tet->seg connection.");
                  lVar17 = (long)this->pointmarkindex;
                  printf("    Tet: x%lx (%d, %d, %d, %d) - ",pppdVar28,
                         (ulong)*(uint *)((long)pppdVar28[orgpivot[iVar10]] + lVar17 * 4),
                         (ulong)*(uint *)((long)pppdVar28[destpivot[iVar10]] + lVar17 * 4),
                         (ulong)*(uint *)((long)pppdVar28[apexpivot[iVar10]] + lVar17 * 4),
                         (ulong)*(uint *)((long)pppdVar28[oppopivot[iVar10]] + lVar17 * 4));
                  if (uVar27 == 0) {
                    puts("Seg: NULL.");
                  }
                  else {
                    printf("Seg x%lx (%d, %d).\n",uVar27,
                           (ulong)*(uint *)(*(long *)(uVar27 + (long)sorgpivot[local_48] * 8) +
                                           (long)this->pointmarkindex * 4),
                           (ulong)*(uint *)(*(long *)(uVar27 + (long)sdestpivot[local_48] * 8) +
                                           (long)this->pointmarkindex * 4));
                  }
                  uVar23 = uVar23 + 1;
                }
                pppdVar26 = (tetrahedron *)
                            ((ulong)pppdVar28[facepivot1[iVar10]] & 0xfffffffffffffff0);
                iVar10 = facepivot2[iVar10][(uint)pppdVar28[facepivot1[iVar10]] & 0xf];
                pppdVar28 = pppdVar26;
              } while (pppdVar11 != pppdVar26);
            }
            else {
              puts("  !! Wrong tet-seg connection.");
              lVar17 = (long)this->pointmarkindex;
              in_stack_ffffffffffffff88 = uVar19;
              printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n",pppdVar11,
                     (ulong)*(uint *)((long)pppdVar11[orgpivot[iVar10]] + lVar17 * 4),
                     (ulong)*(uint *)((long)pppdVar11[destpivot[iVar10]] + lVar17 * 4),
                     (ulong)*(uint *)((long)pppdVar11[apexpivot[iVar10]] + lVar17 * 4),
                     (ulong)*(uint *)((long)pppdVar11[oppopivot[iVar10]] + lVar17 * 4),uVar19,
                     *(undefined4 *)((long)ppdVar4 + lVar17 * 4),
                     *(undefined4 *)((long)ppdVar5 + lVar17 * 4));
              uVar23 = uVar23 + 1;
            }
            uVar27 = *(ulong *)(uVar19 + 0x48) & 0xfffffffffffffff0;
            if (uVar27 == 0) {
              puts("  !! Wrong seg->tet connection (A NULL tet).");
            }
            else {
              uVar22 = (uint)*(ulong *)(uVar19 + 0x48) & 0xf;
              ppdVar7 = *(tetrahedron *)(uVar27 + (long)orgpivot[uVar22] * 8);
              if (((ppdVar7 == ppdVar4) &&
                  (*(tetrahedron *)(uVar27 + (long)destpivot[uVar22] * 8) == ppdVar5)) ||
                 ((ppdVar7 == ppdVar5 &&
                  (*(tetrahedron *)(uVar27 + (long)destpivot[uVar22] * 8) == ppdVar4))))
              goto LAB_0014f76c;
              puts("  !! Wrong seg->tet connection (Wrong edge).");
              uVar18 = (ulong)(uVar22 << 2);
              lVar17 = (long)this->pointmarkindex;
              printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n",uVar27,
                     (ulong)*(uint *)(*(long *)(uVar27 + (long)*(int *)((long)orgpivot + uVar18) * 8
                                               ) + lVar17 * 4),
                     (ulong)*(uint *)(*(long *)(uVar27 + (long)*(int *)((long)destpivot + uVar18) *
                                                         8) + lVar17 * 4),
                     (ulong)*(uint *)(*(long *)(uVar27 + (long)*(int *)((long)apexpivot + uVar18) *
                                                         8) + lVar17 * 4),
                     (ulong)*(uint *)(*(long *)(uVar27 + (long)*(int *)((long)oppopivot + uVar18) *
                                                         8) + lVar17 * 4),uVar19,
                     *(undefined4 *)((long)ppdVar4 + lVar17 * 4),
                     *(undefined4 *)((long)ppdVar5 + lVar17 * 4));
              in_stack_ffffffffffffff88 = uVar19;
            }
            uVar23 = uVar23 + 1;
          }
LAB_0014f76c:
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
      }
      lVar14 = 0;
      do {
        iVar10 = edge2ver[lVar14];
        if ((*(uint *)((long)pppdVar11 + (long)this->elemmarkerindex * 4) >>
             (*(byte *)(ver2edge + iVar10) & 0x1f) & 0x40) != 0) {
          lVar17 = (long)this->pointmarkindex;
          in_stack_ffffffffffffff88 = CONCAT44((int)(in_stack_ffffffffffffff88 >> 0x20),iVar10);
          printf("  !! A marked edge: (%d, %d, %d, %d) -- x%lx %d.\n",
                 (ulong)*(uint *)((long)pppdVar11[orgpivot[iVar10]] + lVar17 * 4),
                 (ulong)*(uint *)((long)pppdVar11[destpivot[iVar10]] + lVar17 * 4),
                 (ulong)*(uint *)((long)pppdVar11[apexpivot[iVar10]] + lVar17 * 4),
                 (ulong)*(uint *)((long)pppdVar11[oppopivot[iVar10]] + lVar17 * 4),pppdVar11,
                 in_stack_ffffffffffffff88);
          pppdVar28 = pppdVar11;
          do {
            pppdVar26 = pppdVar28 + facepivot1[iVar10];
            pppdVar28 = (tetrahedron *)((ulong)*pppdVar26 & 0xfffffffffffffff0);
            iVar10 = facepivot2[iVar10][(uint)*pppdVar26 & 0xf];
            if ((*(uint *)((long)pppdVar28 + (long)this->elemmarkerindex * 4) >>
                 (*(byte *)(ver2edge + iVar10) & 0x1f) & 0x40) == 0) {
              lVar17 = (long)this->pointmarkindex;
              in_stack_ffffffffffffff88 = CONCAT44((int)(in_stack_ffffffffffffff88 >> 0x20),iVar10);
              printf("  !! !! An unmarked edge (%d, %d, %d, %d) -- x%lx %d.\n",
                     (ulong)*(uint *)((long)pppdVar28[orgpivot[iVar10]] + lVar17 * 4),
                     (ulong)*(uint *)((long)pppdVar28[destpivot[iVar10]] + lVar17 * 4),
                     (ulong)*(uint *)((long)pppdVar28[apexpivot[iVar10]] + lVar17 * 4),
                     (ulong)*(uint *)((long)pppdVar28[oppopivot[iVar10]] + lVar17 * 4),pppdVar28,
                     in_stack_ffffffffffffff88);
              uVar23 = uVar23 + 1;
            }
          } while (pppdVar11 != pppdVar28);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 6);
      pppdVar11 = tetrahedrontraverse(this);
    } while (pppdVar11 != (tetrahedron *)0x0);
  }
  if (this->b->quiet == 0) {
    puts("  Checking seg->tet connections...");
  }
  pmVar1 = this->subsegs;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  uVar19 = 0;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  while (puVar12 = (ulong *)memorypool::traverse(pmVar1), puVar12 != (ulong *)0x0) {
    if (puVar12[3] != 0) {
      uVar19 = 0;
      do {
        uVar27 = *puVar12;
        uVar18 = uVar27 & 0xfffffffffffffff8;
        if (uVar18 != 0) {
          uVar8 = puVar12[sorgpivot[0]];
          uVar9 = puVar12[sdestpivot[0]];
          uVar16 = uVar18;
          while( true ) {
            uVar22 = (uint)uVar27;
            uVar21 = uVar22 & 7;
            uVar27 = *(ulong *)(uVar16 + (long)sorgpivot[uVar21] * 8);
            if (((uVar27 != uVar8) || (*(ulong *)(uVar16 + (long)sdestpivot[uVar21] * 8) != uVar9))
               && ((uVar24 = *(ulong *)(uVar16 + (long)sdestpivot[uVar21] * 8), uVar27 != uVar9 ||
                   (uVar24 != uVar8)))) break;
            uVar27 = *(ulong *)(uVar16 + 0x48 + (ulong)(uVar22 & 1) * 8);
            uVar24 = uVar27 & 0xfffffffffffffff0;
            if (uVar24 != 0) {
              uVar21 = stpivottbl[(uint)uVar27 & 0xf][uVar21];
              lVar14 = *(long *)(uVar24 + 0x40);
              do {
                uVar30 = (undefined4)(in_stack_ffffffffffffff88 >> 0x20);
                if (lVar14 == 0) {
LAB_0014fd91:
                  lVar14 = (long)this->pointmarkindex;
                  uVar23 = *(uint *)(*(long *)(uVar24 + (long)orgpivot[(int)uVar21] * 8) +
                                    lVar14 * 4);
                  pcVar20 = "  !! !! No seg at tet (%d, %d, %d, %d) -- x%lx %d\n";
                  printf("  !! !! No seg at tet (%d, %d, %d, %d) -- x%lx %d\n",(ulong)uVar23,
                         (ulong)*(uint *)(*(long *)(uVar24 + (long)destpivot[(int)uVar21] * 8) +
                                         lVar14 * 4),
                         (ulong)*(uint *)(*(long *)(uVar24 + (long)apexpivot[(int)uVar21] * 8) +
                                         lVar14 * 4),
                         (ulong)*(uint *)(*(long *)(uVar24 + (long)oppopivot[(int)uVar21] * 8) +
                                         lVar14 * 4),uVar24,CONCAT44(uVar30,uVar21));
                  if (((tetgenmesh *)pcVar20)->b->quiet == 0) {
                    puts("  Checking Delaunay property of the mesh...");
                  }
                  pmVar1 = ((tetgenmesh *)pcVar20)->tetrahedrons;
                  ppvVar2 = pmVar1->firstblock;
                  pmVar1->pathblock = ppvVar2;
                  pmVar1->pathitem =
                       (void *)((long)ppvVar2 +
                               (((long)pmVar1->alignbytes + 8U) -
                               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
                  pmVar1->pathitemsleft = pmVar1->itemsperblock;
                  pppdVar11 = tetrahedrontraverse((tetgenmesh *)pcVar20);
                  if (pppdVar11 != (tetrahedron *)0x0) {
                    uStackY_d0 = 0;
                    iStackY_cc = 0;
                    uStackY_c8 = 0;
                    goto LAB_0014fe8b;
                  }
                  if (((tetgenmesh *)pcVar20)->b->quiet != 0) {
                    return 0;
                  }
                  goto LAB_00150020;
                }
                uVar27 = *(ulong *)(lVar14 + (long)ver2edge[(int)uVar21] * 8);
                puVar15 = (ulong *)(uVar27 & 0xfffffffffffffff8);
                if (puVar15 == (ulong *)0x0) goto LAB_0014fd91;
                if (puVar12 != puVar15) {
                  uVar27 = (ulong)(((uint)uVar27 & 7) << 2);
                  lVar14 = (long)this->pointmarkindex;
                  in_stack_ffffffffffffff88 =
                       CONCAT44(uVar30,*(undefined4 *)
                                        (*(long *)(uVar24 + (long)oppopivot[(int)uVar21] * 8) +
                                        lVar14 * 4));
                  printf("  !! !! Wrong seg (%d, %d) at tet (%d, %d, %d, %d)\n",
                         (ulong)*(uint *)(puVar15[*(int *)((long)sorgpivot + uVar27)] + lVar14 * 4),
                         (ulong)*(uint *)(puVar15[*(int *)((long)sdestpivot + uVar27)] + lVar14 * 4)
                         ,(ulong)*(uint *)(*(long *)(uVar24 + (long)orgpivot[(int)uVar21] * 8) +
                                          lVar14 * 4),
                         (ulong)*(uint *)(*(long *)(uVar24 + (long)destpivot[(int)uVar21] * 8) +
                                         lVar14 * 4),
                         (ulong)*(uint *)(*(long *)(uVar24 + (long)apexpivot[(int)uVar21] * 8) +
                                         lVar14 * 4),in_stack_ffffffffffffff88);
                  uVar23 = uVar23 + 1;
                }
                uVar27 = *(ulong *)(uVar24 + (long)facepivot1[(int)uVar21] * 8);
                uVar24 = uVar27 & 0xfffffffffffffff0;
                uVar21 = facepivot2[(int)uVar21][(uint)uVar27 & 0xf];
                if ((*(long *)(uVar24 + 0x48) != 0) &&
                   (7 < *(ulong *)(*(long *)(uVar24 + 0x48) + (ulong)(uVar21 & 3) * 8))) break;
                lVar14 = *(long *)(uVar24 + 0x40);
              } while( true );
            }
            uVar27 = *(ulong *)(uVar16 + (ulong)(uVar22 & 6) * 4);
            uVar16 = uVar27 & 0xfffffffffffffff8;
            if ((uVar16 == 0) || (uVar16 == uVar18)) goto LAB_0014fbb5;
          }
          lVar14 = (long)this->pointmarkindex;
          printf("  !! Wrong seg-subface (%d, %d, %d) -- x%lx %d connect\n",
                 (ulong)*(uint *)(uVar27 + lVar14 * 4),(ulong)*(uint *)(uVar24 + lVar14 * 4),
                 (ulong)*(uint *)(*(long *)(uVar16 + (long)sapexpivot[uVar21] * 8) + lVar14 * 4),
                 uVar16);
          uVar23 = uVar23 + 1;
        }
LAB_0014fbb5:
        uVar19 = (ulong)((int)uVar19 + (uint)(puVar12[9] < 0x10));
        pmVar1 = this->subsegs;
        do {
          puVar12 = (ulong *)memorypool::traverse(pmVar1);
          if (puVar12 == (ulong *)0x0) goto LAB_0014fbec;
        } while (puVar12[3] == 0);
      } while( true );
    }
  }
LAB_0014fbec:
  if (this->b->quiet == 0) {
    puts("  Checking seg->seg connections...");
  }
  pmVar1 = this->points;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  do {
    pvVar13 = memorypool::traverse(this->points);
    if (pvVar13 == (void *)0x0) {
LAB_0014fd45:
      if (uVar23 == 0) {
        puts("  Segments are connected properly.");
      }
      else {
        printf("  !! !! !! !! Found %d missing connections.\n",(ulong)uVar23);
      }
      if ((int)uVar19 != 0) {
        printf("  !! !! Found %d missing segments.\n",uVar19);
      }
      return uVar23;
    }
  } while ((*(uint *)((long)pvVar13 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
  do {
    if ((*(uint *)((long)pvVar13 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0x600) {
      pcVar20 = "  !! Dead point-to-seg pointer at point %d.\n";
      uVar27 = *(ulong *)((long)pvVar13 + (long)this->point2simindex * 8 + 0x10) &
               0xfffffffffffffff8;
      if ((uVar27 != 0) &&
         (pcVar20 = "  !! Dead point-to-seg pointer at point %d.\n", *(long *)(uVar27 + 0x18) != 0))
      {
        lVar14 = (long)sorgpivot[0];
        if (*(void **)(uVar27 + lVar14 * 8) == pvVar13) {
          uVar27 = *(ulong *)(uVar27 + (long)(snextpivot[snextpivot[0]] >> 1) * 8);
          lVar14 = (long)sdestpivot[0];
        }
        else {
          pcVar20 = "  !! Wrong point-to-seg pointer at point %d.\n";
          if (*(void **)(uVar27 + (long)sdestpivot[0] * 8) != pvVar13) goto LAB_0014fd10;
          uVar27 = *(ulong *)(uVar27 + (long)(snextpivot[0] >> 1) * 8);
        }
        pcVar20 = "  !! Wrong seg-seg connection at point %d.\n";
        if (*(void **)((uVar27 & 0xfffffffffffffff8) + lVar14 * 8) == pvVar13) goto LAB_0014fd1d;
      }
LAB_0014fd10:
      printf(pcVar20,(ulong)*(uint *)((long)pvVar13 + (long)this->pointmarkindex * 4));
      uVar23 = uVar23 + 1;
    }
LAB_0014fd1d:
    do {
      pvVar13 = memorypool::traverse(this->points);
      if (pvVar13 == (void *)0x0) goto LAB_0014fd45;
    } while ((*(uint *)((long)pvVar13 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
  } while( true );
LAB_0014fe8b:
  paiVar25 = fsymtbl;
  lVar14 = 0;
  do {
    uVar19 = *(ulong *)((long)pppdVar11 + lVar14 * 2);
    pppdVar28 = (tetrahedron *)(uVar19 & 0xfffffffffffffff0);
    if (pppdVar11 < pppdVar28 && pppdVar28[7] != (tetrahedron)((tetgenmesh *)pcVar20)->dummypoint) {
      ppdVar3 = pppdVar11[*(int *)((long)orgpivot + lVar14)];
      ppdVar4 = pppdVar11[*(int *)((long)destpivot + lVar14)];
      ppdVar5 = pppdVar11[*(int *)((long)apexpivot + lVar14)];
      ppdVar7 = pppdVar11[*(int *)((long)oppopivot + lVar14)];
      pe = pppdVar28[oppopivot[(*paiVar25)[(uint)uVar19 & 0xf]]];
      if (uVar23 == 0) {
        dVar29 = insphere((double *)ppdVar3,(double *)ppdVar4,(double *)ppdVar5,(double *)ppdVar7,
                          (double *)pe);
      }
      else {
        dVar29 = insphere_s((tetgenmesh *)pcVar20,(double *)ppdVar3,(double *)ppdVar4,
                            (double *)ppdVar5,(double *)ppdVar7,(double *)pe);
      }
      if (dVar29 < 0.0) {
        iStackY_cc = iStackY_cc + 1;
        if (((tetgenmesh *)pcVar20)->checksubfaceflag == 0) {
LAB_0014ff87:
          if (uStackY_c8 != 0) goto LAB_0014ffd4;
        }
        else if (pppdVar11[9] != (tetrahedron)0x0) {
          uStackY_c8 = *(ulong *)((long)pppdVar11[9] + lVar14 * 2) & 0xfffffffffffffff8;
          goto LAB_0014ff87;
        }
        lVar17 = (long)((tetgenmesh *)pcVar20)->pointmarkindex;
        printf("  !! Non-locally Delaunay (%d, %d, %d) - %d, %d\n",
               (ulong)*(uint *)((long)ppdVar3 + lVar17 * 4),
               (ulong)*(uint *)((long)ppdVar4 + lVar17 * 4),
               (ulong)*(uint *)((long)ppdVar5 + lVar17 * 4),
               (ulong)*(uint *)((long)ppdVar7 + lVar17 * 4),(ulong)*(uint *)((long)pe + lVar17 * 4))
        ;
        uStackY_d0 = uStackY_d0 + 1;
        uStackY_c8 = 0;
      }
    }
LAB_0014ffd4:
    lVar14 = lVar14 + 4;
    paiVar25 = paiVar25 + 1;
  } while (lVar14 != 0x10);
  pppdVar11 = tetrahedrontraverse((tetgenmesh *)pcVar20);
  if (pppdVar11 == (tetrahedron *)0x0) {
    if (uStackY_d0 == 0) {
      uStackY_d0 = 0;
      if (((tetgenmesh *)pcVar20)->b->quiet == 0) {
        if (iStackY_cc < 1) {
LAB_00150020:
          puts("  The mesh is Delaunay.");
          uStackY_d0 = 0;
        }
        else {
          puts("  The mesh is constrained Delaunay.");
        }
      }
    }
    else {
      printf("  !! !! !! !! Found %d non-Delaunay faces.\n",(ulong)uStackY_d0);
    }
    return uStackY_d0;
  }
  goto LAB_0014fe8b;
}

Assistant:

int tetgenmesh::checksegments()
{
  triface tetloop, neightet, spintet;
  shellface *segs;
  face neighsh, spinsh, checksh;
  face sseg, checkseg;
  point pa, pb;
  int miscount;
  int t1ver;
  int horrors, i;


  if (!b->quiet) {
    printf("  Checking tet->seg connections...\n");
  }

  horrors = 0;
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != NULL) {
    // Loop the six edges of the tet.
    if (tetloop.tet[8] != NULL) {
      segs = (shellface *) tetloop.tet[8];
      for (i = 0; i < 6; i++) {
        sdecode(segs[i], sseg);
        if (sseg.sh != NULL) {
          // Get the edge of the tet.
          tetloop.ver = edge2ver[i];
          // Check if they are the same edge.
          pa = (point) sseg.sh[3];
          pb = (point) sseg.sh[4];
          if (!(((org(tetloop) == pa) && (dest(tetloop) == pb)) ||
                ((org(tetloop) == pb) && (dest(tetloop) == pa)))) {
            printf("  !! Wrong tet-seg connection.\n");
            printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n", 
                   (uintptr_t) tetloop.tet, pointmark(org(tetloop)),
                   pointmark(dest(tetloop)), pointmark(apex(tetloop)),
                   pointmark(oppo(tetloop)), (uintptr_t) sseg.sh,
                   pointmark(pa), pointmark(pb));
            horrors++;
          } else {
            // Loop all tets sharing at this edge.
            neightet = tetloop;
            do {
              tsspivot1(neightet, checkseg);
              if (checkseg.sh != sseg.sh) {
                printf("  !! Wrong tet->seg connection.\n");
                printf("    Tet: x%lx (%d, %d, %d, %d) - ", 
                       (uintptr_t) neightet.tet, pointmark(org(neightet)),
                       pointmark(dest(neightet)), pointmark(apex(neightet)),
                       pointmark(oppo(neightet)));
                if (checkseg.sh != NULL) {
                  printf("Seg x%lx (%d, %d).\n", (uintptr_t) checkseg.sh,
                         pointmark(sorg(checkseg)),pointmark(sdest(checkseg))); 
                } else {
                  printf("Seg: NULL.\n");
                }
                horrors++;
              }
              fnextself(neightet);
            } while (neightet.tet != tetloop.tet);
          }
          // Check the seg->tet pointer.
          sstpivot1(sseg, neightet);
          if (neightet.tet == NULL) {
            printf("  !! Wrong seg->tet connection (A NULL tet).\n");
            horrors++;
          } else {
            if (!(((org(neightet) == pa) && (dest(neightet) == pb)) ||
                ((org(neightet) == pb) && (dest(neightet) == pa)))) {
              printf("  !! Wrong seg->tet connection (Wrong edge).\n");
              printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n", 
                     (uintptr_t) neightet.tet, pointmark(org(neightet)),
                     pointmark(dest(neightet)), pointmark(apex(neightet)),
                     pointmark(oppo(neightet)), (uintptr_t) sseg.sh,
                     pointmark(pa), pointmark(pb));
              horrors++;
            }
          }
        }
      }
    }
    // Loop the six edge of this tet.
    neightet.tet = tetloop.tet;
    for (i = 0; i < 6; i++) {
      neightet.ver = edge2ver[i];
      if (edgemarked(neightet)) {
        // A possible bug. Report it.
        printf("  !! A marked edge: (%d, %d, %d, %d) -- x%lx %d.\n",
               pointmark(org(neightet)), pointmark(dest(neightet)),
               pointmark(apex(neightet)), pointmark(oppo(neightet)),
               (uintptr_t) neightet.tet, neightet.ver);
        // Check if all tets at the edge are marked.
        spintet = neightet;
        while (1) {
          fnextself(spintet);
          if (!edgemarked(spintet)) {
            printf("  !! !! An unmarked edge (%d, %d, %d, %d) -- x%lx %d.\n",
                   pointmark(org(spintet)), pointmark(dest(spintet)),
                   pointmark(apex(spintet)), pointmark(oppo(spintet)),
                   (uintptr_t) spintet.tet, spintet.ver);
            horrors++;
          }
          if (spintet.tet == neightet.tet) break;
        }
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (!b->quiet) {
    printf("  Checking seg->tet connections...\n");
  }

  miscount = 0; // Count the number of unrecovered segments.
  subsegs->traversalinit();
  sseg.shver = 0;
  sseg.sh = shellfacetraverse(subsegs);
  while (sseg.sh != NULL) {
    pa = sorg(sseg);
    pb = sdest(sseg);
    spivot(sseg, neighsh);
    if (neighsh.sh != NULL) {      
      spinsh = neighsh;
      while (1) {
        // Check seg-subface bond.
        if (((sorg(spinsh) == pa) && (sdest(spinsh) == pb)) ||
	    ((sorg(spinsh) == pb) && (sdest(spinsh) == pa))) {
          // Keep the same rotate direction.
          //if (sorg(spinsh) != pa) {          
          //  sesymself(spinsh);
          //  printf("  !! Wrong ori at subface (%d, %d, %d) -- x%lx %d\n",
          //         pointmark(sorg(spinsh)), pointmark(sdest(spinsh)),
          //         pointmark(sapex(spinsh)), (uintptr_t) spinsh.sh,
          //         spinsh.shver);
          //  horrors++;
          //}
          stpivot(spinsh, spintet);
          if (spintet.tet != NULL) {
            // Check if all tets at this segment.
            while (1) {
              tsspivot1(spintet, checkseg);
              if (checkseg.sh == NULL) {
                printf("  !! !! No seg at tet (%d, %d, %d, %d) -- x%lx %d\n",
                       pointmark(org(spintet)), pointmark(dest(spintet)),
                       pointmark(apex(spintet)), pointmark(oppo(spintet)),
                       (uintptr_t) spintet.tet, spintet.ver);
                horrors++;
              }
              if (checkseg.sh != sseg.sh) {
                printf("  !! !! Wrong seg (%d, %d) at tet (%d, %d, %d, %d)\n",
                       pointmark(sorg(checkseg)), pointmark(sdest(checkseg)),
                       pointmark(org(spintet)), pointmark(dest(spintet)),
                       pointmark(apex(spintet)), pointmark(oppo(spintet)));
                horrors++;
              }
              fnextself(spintet);
              // Stop at the next subface.
              tspivot(spintet, checksh);
              if (checksh.sh != NULL) break;
            } // while (1)
          }
        } else { 
          printf("  !! Wrong seg-subface (%d, %d, %d) -- x%lx %d connect\n",
                 pointmark(sorg(spinsh)), pointmark(sdest(spinsh)),
                 pointmark(sapex(spinsh)), (uintptr_t) spinsh.sh,
                 spinsh.shver);
          horrors++;
          break;
        } // if pa, pb
        spivotself(spinsh);
        if (spinsh.sh == NULL) break; // A dangling segment.
        if (spinsh.sh == neighsh.sh) break;
      } // while (1)
    } // if (neighsh.sh != NULL)
    // Count the number of "un-recovered" segments.
    sstpivot1(sseg, neightet);
    if (neightet.tet == NULL) {
      miscount++;
    }
    sseg.sh = shellfacetraverse(subsegs);
  }

  if (!b->quiet) {
    printf("  Checking seg->seg connections...\n");
  }

  points->traversalinit();
  pa = pointtraverse();
  while (pa != NULL) {
    if (pointtype(pa) == FREESEGVERTEX) {
      // There should be two subsegments connected at 'pa'.
      // Get a subsegment containing 'pa'.
      sdecode(point2sh(pa), sseg);
      if ((sseg.sh == NULL) || sseg.sh[3] == NULL) {
        printf("  !! Dead point-to-seg pointer at point %d.\n",
               pointmark(pa));
        horrors++;
      } else {
        sseg.shver = 0;
        if (sorg(sseg) != pa) {
          if (sdest(sseg) != pa) {
            printf("  !! Wrong point-to-seg pointer at point %d.\n",
                   pointmark(pa));
            horrors++;
          } else {
            // Find the next subsegment at 'pa'.
            senext(sseg, checkseg);
            if ((checkseg.sh == NULL) || (checkseg.sh[3] == NULL)) {
              printf("  !! Dead seg-seg connection at point %d.\n",
                     pointmark(pa));
              horrors++;
            } else {
              spivotself(checkseg);
              checkseg.shver = 0;
              if (sorg(checkseg) != pa) {
                printf("  !! Wrong seg-seg connection at point %d.\n",
                     pointmark(pa));
                horrors++;
              }
            }
          }
        } else {
          // Find the previous subsegment at 'pa'.
          senext2(sseg, checkseg);
          if ((checkseg.sh == NULL) || (checkseg.sh[3] == NULL)) {
            printf("  !! Dead seg-seg connection at point %d.\n",
                   pointmark(pa));
            horrors++;
          } else {
            spivotself(checkseg);
            checkseg.shver = 0;
            if (sdest(checkseg) != pa) {
              printf("  !! Wrong seg-seg connection at point %d.\n",
                     pointmark(pa));
              horrors++;
            }
          }
        }
      }
    }
    pa = pointtraverse();
  }

  if (horrors == 0) {
    printf("  Segments are connected properly.\n");
  } else {
    printf("  !! !! !! !! Found %d missing connections.\n", horrors);
  }
  if (miscount > 0) {
    printf("  !! !! Found %d missing segments.\n", miscount);
  }

  return horrors;
}